

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# line_monte_carlo.cpp
# Opt level: O2

double * line01_sample_ergodic(int n,double *shift)

{
  double *pdVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  double dVar5;
  
  uVar3 = 0;
  uVar2 = 0xffffffffffffffff;
  if (-1 < n) {
    uVar2 = (ulong)(uint)n << 3;
  }
  uVar4 = (ulong)(uint)n;
  if (n < 1) {
    uVar4 = uVar3;
  }
  pdVar1 = (double *)operator_new__(uVar2);
  dVar5 = fmod(*shift,1.0);
  *shift = dVar5;
  for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
    pdVar1[uVar3] = dVar5;
    dVar5 = fmod(dVar5 + 1.618033988749895,1.0);
    *shift = dVar5;
  }
  return pdVar1;
}

Assistant:

double *line01_sample_ergodic ( int n, double &shift )

//****************************************************************************80
//
//  Purpose:
//
//    LINE01_SAMPLE_ERGODIC samples the unit line in 1D.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    07 June 2017
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int N, the number of points.
//
//    Input/output, double &SHIFT, a value between 0 and 1.
//
//    Output, double X[N], the points.
//
{
  double golden;
  int j;
  double *x;

  golden = ( 1.0 + sqrt ( 5.0 ) ) / 2.0;

  x = new double[n];

  shift = fmod ( shift, 1.0 );

  for ( j = 0; j < n; j++ )
  {
    x[j] = shift;
    shift = fmod ( shift + golden, 1.0 );
  }

  return x;
}